

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.hpp
# Opt level: O2

bool __thiscall tcu::Interval::isOrdinary(Interval *this)

{
  if (this->m_hasNaN == false) {
    if (this->m_lo <= this->m_hi) {
      return this->m_hi != INFINITY && this->m_lo != -INFINITY;
    }
  }
  return false;
}

Assistant:

bool		isOrdinary		(void) const { return !hasNaN() && !empty() && isFinite(); }